

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O0

Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  Arena *pAVar1;
  undefined8 local_30;
  Arena *arena;
  Value<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>_> *result;
  RepeatedPtrFieldBase *this_local;
  
  local_30 = UnsafeArenaReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                       (this);
  pAVar1 = GetArena(this);
  if (pAVar1 != (Arena *)0x0) {
    local_30 = copy<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
                         (local_30);
  }
  return local_30;
}

Assistant:

[[nodiscard]] Value<TypeHandler>* ReleaseLast() {
    Value<TypeHandler>* result = UnsafeArenaReleaseLast<TypeHandler>();
    // Now perform a copy if we're on an arena.
    Arena* arena = GetArena();

    if (internal::DebugHardenForceCopyInRelease()) {
      auto* new_result = copy<TypeHandler>(result);
      if (arena == nullptr) delete result;
      return new_result;
    } else {
      return (arena == nullptr) ? result : copy<TypeHandler>(result);
    }
  }